

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaWorker.cpp
# Opt level: O3

void __thiscall xmrig::CudaWorker::CudaWorker(CudaWorker *this,size_t id,CudaLaunchData *data)

{
  CudaCnRunner *this_00;
  
  Worker::Worker(&this->super_Worker,id,(data->thread).m_affinity,-1);
  (this->super_Worker).super_IWorker._vptr_IWorker = (_func_int **)&PTR__CudaWorker_001ad428;
  this->m_miner = data->miner;
  this->m_runner = (ICudaRunner *)0x0;
  memset(&(this->m_job).m_jobs[0].m_diff,0,0x99);
  memset(&(this->m_job).m_jobs[1].m_diff,0,0x99);
  memset(&this->m_job,0,0x15c);
  (this->m_job).m_jobs[0].m_extraIters = 0;
  (this->m_job).m_jobs[1].m_seed.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_seed.m_size = 0;
  (this->m_job).m_jobs[1].m_size = 0;
  (this->m_job).m_jobs[1].m_clientId.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_clientId.m_size = 0;
  (this->m_job).m_jobs[1].m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_extraNonce.m_size = 0;
  (this->m_job).m_jobs[1].m_id.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_id.m_size = 0;
  (this->m_job).m_jobs[1].m_poolWallet.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_poolWallet.m_size = 0;
  (this->m_job).m_jobs[1].m_backend = 0;
  (this->m_job).m_jobs[1].m_extraIters = 0;
  (this->m_job).m_rounds[0] = 0;
  (this->m_job).m_rounds[1] = 0;
  *(undefined8 *)((long)(this->m_job).m_rounds + 1) = 0;
  *(undefined8 *)((long)&(this->m_job).m_sequence + 1) = 0;
  this_00 = (CudaCnRunner *)operator_new(0x30);
  CudaCnRunner::CudaCnRunner(this_00,id,data);
  this->m_runner = (ICudaRunner *)this_00;
  (*(this_00->super_CudaBaseRunner).super_ICudaRunner._vptr_ICudaRunner[3])(this_00);
  return;
}

Assistant:

xmrig::CudaWorker::CudaWorker(size_t id, const CudaLaunchData &data) :
    Worker(id, data.thread.affinity(), -1),
    m_miner(data.miner)
{
    m_runner = new CudaCnRunner(id, data);

    if (!m_runner || !m_runner->init()) {
        return;
    }
}